

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iso_writer.cpp
# Opt level: O3

void __thiscall IsoWriter::allocateMetadata(IsoWriter *this)

{
  int iVar1;
  void *__s;
  _Rb_tree_node_base *p_Var2;
  runtime_error *this_00;
  int iVar3;
  void *pvVar4;
  uint32_t *pos32;
  _Rb_tree_color *p_Var5;
  size_t __n;
  
  iVar1 = allocateEntity(this,this->m_rootDirInfo,2);
  this->m_systemStreamLBN = iVar1;
  allocateEntity(this,this->m_systemStreamDir,iVar1);
  iVar1 = this->m_metadataFileLen;
  iVar3 = iVar1 + 0x7ff;
  if (-1 < (long)iVar1) {
    iVar3 = iVar1;
  }
  __n = (size_t)(uint)(iVar3 >> 0xb);
  if (this->m_systemStreamLBN + 3 <= iVar3 >> 0xb) {
    File::seek(&this->m_file,(long)iVar1 + 0xa0000,smBegin);
    __s = operator_new__(0x10000);
    memset(__s,0,0x10000);
    strcpy((char *)((long)__s + 1),(this->m_impId)._M_dataplus._M_p);
    *(undefined4 *)((long)__s + 0x20) = 0;
    *(uint *)((long)__s + 0x24) =
         (uint)(ushort)(this->m_mappingEntries)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    *(undefined8 *)((long)__s + 0x28) = 0;
    p_Var5 = (_Rb_tree_color *)((long)__s + 0x30);
    for (p_Var2 = (this->m_mappingEntries)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var2 != &(this->m_mappingEntries)._M_t._M_impl.super__Rb_tree_header;
        p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
      *p_Var5 = p_Var2[1]._M_color;
      p_Var5[1] = *(_Rb_tree_color *)&p_Var2[1].field_0x4;
      __n = (size_t)*(_Rb_tree_color *)&p_Var2[1]._M_parent;
      p_Var5[2] = *(_Rb_tree_color *)&p_Var2[1]._M_parent;
      p_Var5[3] = 0x10001;
      p_Var5 = p_Var5 + 4;
    }
    pvVar4 = __s;
    FileEntryInfo::write
              (this->m_metadataMappingFile,(int)__s,(void *)(ulong)(uint)((int)p_Var5 - (int)__s),
               __n);
    FileEntryInfo::close(this->m_metadataMappingFile,(int)pvVar4);
    operator_delete__(__s);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error
            (this_00,
             "ISO error: Not enough space in metadata partition. It possible in a split mode if a lot of files. Please provide addition input parameter --extra-iso-space to increate metadata space. Default value for this parameter in split mode: 4"
            );
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void IsoWriter::allocateMetadata()
{
    constexpr int sectorNum = 2;  // reserve sector for file set descriptor and terminating descriptor
    m_systemStreamLBN = allocateEntity(m_rootDirInfo, sectorNum);
    allocateEntity(m_systemStreamDir, m_systemStreamLBN);

    if (m_systemStreamLBN + 3 > m_metadataFileLen / SECTOR_SIZE)
        throw std::runtime_error(
            "ISO error: Not enough space in metadata partition. It possible in a split mode if a lot of files. Please "
            "provide addition input parameter --extra-iso-space to increate metadata space. Default value for this "
            "parameter in split mode: 4");

    // write udf unique id mapping file
    m_file.seek(static_cast<int64_t>(METADATA_START_ADDR) * SECTOR_SIZE + m_metadataFileLen);

    const auto buffer = new uint8_t[ALLOC_BLOCK_SIZE];
    memset(buffer, 0, ALLOC_BLOCK_SIZE);
    ByteFileWriter writer;
    writer.setBuffer(buffer, ALLOC_BLOCK_SIZE);

    writer.writeCharSpecString(m_impId.c_str(), 32);
    writer.writeLE32(0);  // flags
    writer.writeLE32(static_cast<uint16_t>(m_mappingEntries.size()));
    writer.writeLE32(0);  // reserved
    writer.writeLE32(0);  // reserved

    for (const auto &mappingEntry : m_mappingEntries)
    {
        writer.writeLE32(mappingEntry.first);  // unique ID
        writer.writeLE32(mappingEntry.second.parentLBN);
        writer.writeLE32(mappingEntry.second.LBN);
        writer.writeLE16(1);  // parent partition
        writer.writeLE16(1);  // object partition
    }

    m_metadataMappingFile->write(buffer, static_cast<int32_t>(writer.size()));
    m_metadataMappingFile->close();
    delete[] buffer;
}